

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O0

void ans_byte_decompress(void *dst,size_t to_decode,void *cSrc,size_t cSrcSize)

{
  uint8_t uVar1;
  ans_byte_decode *this;
  uint8_t **in_u8_00;
  ulong uVar2;
  long in_RCX;
  uint8_t *in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t fast_decode;
  uint8_t *out_u8;
  size_t cur_idx;
  uint64_t state_a;
  uint64_t state_b;
  uint64_t state_c;
  uint64_t state_d;
  ans_byte_decode ans_frame;
  uint8_t *in_u8;
  ans_byte_decode *this_00;
  ulong local_498;
  uint8_t *in_stack_ffffffffffffffb8;
  uint8_t *local_28;
  long local_20;
  ulong local_10;
  long local_8;
  
  this_00 = (ans_byte_decode *)&stack0xfffffffffffffba0;
  local_28 = in_RDX;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ans_byte_decode::load(in_stack_ffffffffffffffb8);
  local_28 = local_28 + local_20;
  this = (ans_byte_decode *)ans_byte_decode::init_state(this_00,&local_28);
  in_u8_00 = (uint8_t **)
             ans_byte_decode::init_state((ans_byte_decode *)&stack0xfffffffffffffba0,&local_28);
  ans_byte_decode::init_state((ans_byte_decode *)&stack0xfffffffffffffba0,&local_28);
  ans_byte_decode::init_state((ans_byte_decode *)&stack0xfffffffffffffba0,&local_28);
  uVar2 = local_10 - (local_10 & 3);
  for (local_498 = 0; local_498 != uVar2; local_498 = local_498 + 4) {
    uVar1 = ans_byte_decode::decode_sym(this,(uint64_t *)this_00,in_u8_00);
    *(uint8_t *)(local_8 + local_498) = uVar1;
    uVar1 = ans_byte_decode::decode_sym(this,(uint64_t *)this_00,in_u8_00);
    *(uint8_t *)(local_498 + 1 + local_8) = uVar1;
    uVar1 = ans_byte_decode::decode_sym(this,(uint64_t *)this_00,in_u8_00);
    *(uint8_t *)(local_498 + 2 + local_8) = uVar1;
    uVar1 = ans_byte_decode::decode_sym(this,(uint64_t *)this_00,in_u8_00);
    *(uint8_t *)(local_8 + 3 + local_498) = uVar1;
  }
  while (local_498 != local_10) {
    uVar1 = ans_byte_decode::decode_sym(this,(uint64_t *)this_00,in_u8_00);
    *(uint8_t *)(local_8 + local_498) = uVar1;
    local_498 = local_498 + 1;
  }
  ans_byte_decode::~ans_byte_decode((ans_byte_decode *)0x18a396);
  return;
}

Assistant:

void ans_byte_decompress(
    void* dst, size_t to_decode, const void* cSrc, size_t cSrcSize)
{
    auto in_u8 = reinterpret_cast<const uint8_t*>(cSrc);
    auto ans_frame = ans_byte_decode::load(in_u8);
    in_u8 += cSrcSize;

    auto state_d = ans_frame.init_state(in_u8);
    auto state_c = ans_frame.init_state(in_u8);
    auto state_b = ans_frame.init_state(in_u8);
    auto state_a = ans_frame.init_state(in_u8);

    size_t cur_idx = 0;
    auto out_u8 = reinterpret_cast<uint8_t*>(dst);
    size_t fast_decode = to_decode - (to_decode % 4);
    while (cur_idx != fast_decode) {
        out_u8[cur_idx] = ans_frame.decode_sym(state_d, in_u8);
        out_u8[cur_idx + 1] = ans_frame.decode_sym(state_c, in_u8);
        out_u8[cur_idx + 2] = ans_frame.decode_sym(state_b, in_u8);
        out_u8[cur_idx + 3] = ans_frame.decode_sym(state_a, in_u8);
        cur_idx += 4;
    }
    while (cur_idx != to_decode) {
        out_u8[cur_idx++] = ans_frame.decode_sym(state_a, in_u8);
    }
}